

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void pbrt::LogFatal(LogLevel level,char *file,int line,char *s)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  LogLevel level_00;
  uint *in_FS_OFFSET;
  long *local_70;
  long local_60 [2];
  string local_50;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&LogFatal::mutex);
  __stream = _stderr;
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  uVar3 = getpid();
  pbrt::ThreadIndex::__tls_init();
  uVar1 = *in_FS_OFFSET;
  (anonymous_namespace)::TimeNow_abi_cxx11_();
  ToString_abi_cxx11_(&local_50,(pbrt *)(ulong)level,level_00);
  fprintf(__stream,"[ %d.%03d %s %s:%d ] %s %s\n",(ulong)uVar3,(ulong)uVar1,local_70,file,
          (ulong)(uint)line,local_50._M_dataplus._M_p,s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  CheckCallbackScope::Fail();
  abort();
}

Assistant:

void LogFatal(LogLevel level, const char *file, int line, const char *s) {
#ifdef PBRT_IS_GPU_CODE
    Log(LogLevel::Fatal, file, line, s);
    __threadfence();
    asm("trap;");
#else
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    fprintf(stderr, "[ " LOG_BASE_FMT " %s:%d ] %s %s\n", LOG_BASE_ARGS, file, line,
            ToString(level).c_str(), s);

    CheckCallbackScope::Fail();
    abort();
#endif
}